

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void __thiscall
VectorWriter::
VectorWriter<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
          ParamsWrapper<CNetAddr::SerParams,_CService> *args_4,unsigned_long *args_5,
          ParamsWrapper<CNetAddr::SerParams,_CService> *args_6,unsigned_long *args_7,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,int *args_9,
          bool *args_10)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  VectorWriter(this,vchDataIn,nPosIn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SerializeMany<VectorWriter,int,unsigned_long,long,unsigned_long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool>
              (this,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }